

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator=(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *rhs)

{
  int **p;
  int *piVar1;
  undefined4 *puVar2;
  char cVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  pointer pnVar10;
  undefined8 *puVar11;
  long lVar12;
  pointer pnVar13;
  undefined8 *puVar14;
  pointer pnVar15;
  undefined4 *puVar16;
  long lVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar18 = 0;
  if (this != rhs) {
    clear(this);
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(rhs->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar7 = (rhs->super_IdxSet).len;
    (this->super_IdxSet).len = iVar7;
    p = &(this->super_IdxSet).idx;
    spx_realloc<int*>(p,iVar7);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)((ulong)((long)(rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(rhs->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7),true);
    if (rhs->setupStatus == true) {
      IdxSet::operator=(&this->super_IdxSet,&rhs->super_IdxSet);
      lVar8 = (long)(this->super_IdxSet).num;
      if (0 < lVar8) {
        uVar9 = lVar8 + 1;
        do {
          iVar7 = (*p)[uVar9 - 2];
          pnVar10 = (rhs->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar4 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar13 = pnVar10 + iVar7;
          pnVar15 = pnVar4 + iVar7;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          pnVar4[iVar7].m_backend.exp = pnVar10[iVar7].m_backend.exp;
          pnVar4[iVar7].m_backend.neg = pnVar10[iVar7].m_backend.neg;
          iVar6 = pnVar10[iVar7].m_backend.prec_elem;
          pnVar4[iVar7].m_backend.fpclass = pnVar10[iVar7].m_backend.fpclass;
          pnVar4[iVar7].m_backend.prec_elem = iVar6;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
      }
    }
    else {
      (this->super_IdxSet).num = 0;
      pnVar10 = (rhs->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(rhs->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar10) >> 7))
      {
        lVar17 = 0x78;
        lVar8 = 0;
        do {
          puVar14 = (undefined8 *)((long)&(pnVar10->m_backend).data + lVar17);
          iVar7 = *(int *)(puVar14 + -1);
          cVar3 = *(char *)((long)puVar14 + -4);
          uVar5 = *puVar14;
          memmove(&local_130,puVar14 + -0xf,0x70);
          local_130.neg = (bool)cVar3;
          if ((cVar3 == '\x01') &&
             ((fpclass_type)uVar5 != cpp_dec_float_finite || local_130.data._M_elems[0] != 0)) {
            local_130.neg = false;
          }
          local_130.exp = iVar7;
          local_130._120_8_ = uVar5;
          getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_b0,this);
          if (((local_130.fpclass != cpp_dec_float_NaN) && (local_b0.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_130,&local_b0), 0 < iVar7)) {
            puVar11 = (undefined8 *)
                      ((long)&(((rhs->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar17
                      );
            puVar2 = (undefined4 *)
                     ((long)&(((this->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                     lVar17 + -0x78);
            puVar14 = puVar11 + -0xf;
            puVar16 = puVar2;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar16 = *(undefined4 *)puVar14;
              puVar14 = (undefined8 *)((long)puVar14 + (ulong)bVar18 * -8 + 4);
              puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
            }
            puVar2[0x1c] = *(undefined4 *)(puVar11 + -1);
            *(undefined1 *)(puVar2 + 0x1d) = *(undefined1 *)((long)puVar11 + -4);
            *(undefined8 *)(puVar2 + 0x1e) = *puVar11;
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)lVar8;
            piVar1 = &(this->super_IdxSet).num;
            *piVar1 = *piVar1 + 1;
          }
          lVar8 = lVar8 + 1;
          pnVar10 = (rhs->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x80;
        } while (lVar8 < (int)((ulong)((long)(rhs->
                                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pnVar10) >> 7));
      }
    }
    this->setupStatus = true;
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }